

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImVec2 ImGui::FindBestWindowPosForPopupEx
                 (ImVec2 *ref_pos,ImVec2 *size,ImGuiDir *last_dir,ImRect *r_outer,ImRect *r_avoid,
                 ImGuiPopupPositionPolicy policy)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImVec2 IVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  ulong uVar13;
  int *piVar14;
  uint *puVar15;
  uint *puVar16;
  ImGuiDir *pIVar17;
  ImVec2 IVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 in_ZMM13 [64];
  undefined1 auVar32 [16];
  
  IVar4 = *ref_pos;
  auVar25._8_8_ = 0;
  auVar25._0_4_ = IVar4.x;
  auVar25._4_4_ = IVar4.y;
  auVar26._8_8_ = 0;
  auVar26._0_4_ = (r_outer->Max).x;
  auVar26._4_4_ = (r_outer->Max).y;
  IVar18 = *size;
  auVar24._8_8_ = 0;
  auVar24._0_4_ = IVar18.x;
  auVar24._4_4_ = IVar18.y;
  auVar11 = vsubps_avx(auVar26,auVar24);
  auVar21 = vcmpps_avx(auVar11,auVar25,1);
  auVar21 = vshufps_avx(auVar21,auVar21,0x50);
  uVar12 = vmovmskpd_avx(auVar21);
  auVar21 = auVar11;
  if ((uVar12 & 1) == 0) {
    auVar21 = auVar25;
  }
  auVar9 = vmovshdup_avx(auVar25);
  auVar31 = auVar9;
  if ((uVar12 & 2) != 0) {
    auVar31 = vmovshdup_avx(auVar11);
  }
  auVar22._8_8_ = 0;
  auVar22._0_4_ = (r_outer->Min).x;
  auVar22._4_4_ = (r_outer->Min).y;
  auVar11 = vmovshdup_avx(auVar24);
  fVar23 = IVar18.x;
  fVar27 = auVar11._0_4_;
  if (policy == ImGuiPopupPositionPolicy_ComboBox) {
    iVar5 = *last_dir;
    uVar13 = (ulong)(iVar5 == -1);
    auVar19 = ZEXT416((uint)((r_avoid->Max).x - fVar23));
    auVar28 = ZEXT416((uint)((r_avoid->Min).y - fVar27));
    auVar11 = vinsertps_avx(auVar19,auVar28,0x10);
    auVar29 = ZEXT416((uint)(r_avoid->Max).y);
    auVar19 = vinsertps_avx(auVar19,auVar29,0x10);
    auVar28 = vinsertps_avx((undefined1  [16])*r_avoid,auVar28,0x10);
    auVar29 = vinsertps_avx((undefined1  [16])*r_avoid,auVar29,0x10);
    piVar14 = (int *)(&DAT_001e8bd0 + (ulong)(iVar5 != -1) * -4);
    auVar10 = vpcmpeqd_avx(in_ZMM13._0_16_,in_ZMM13._0_16_);
    do {
      pIVar17 = last_dir;
      if (uVar13 != 0) {
        pIVar17 = piVar14;
      }
      iVar6 = *pIVar17;
      if ((uVar13 == 0) || (iVar6 != iVar5)) {
        switch(iVar6) {
        case 0:
          auVar20 = auVar19;
          break;
        case 1:
          auVar20 = auVar28;
          break;
        case 2:
          auVar20 = auVar11;
          break;
        case 3:
          auVar20 = auVar29;
          break;
        default:
          auVar20 = ZEXT816(0) << 0x40;
        }
        auVar32._0_4_ = fVar23 + auVar20._0_4_;
        auVar32._4_4_ = IVar18.y + auVar20._4_4_;
        auVar32._8_4_ = auVar20._8_4_ + 0.0;
        auVar32._12_4_ = auVar20._12_4_ + 0.0;
        auVar32 = vmovlhps_avx(auVar32,auVar22);
        auVar8 = vmovlhps_avx(auVar26,auVar20);
        auVar32 = vcmpps_avx(auVar32,auVar8,2);
        auVar32 = auVar10 & ~auVar32;
        if ((((auVar32 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar32 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar32 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar32[0xf]
           ) {
          *last_dir = iVar6;
          return auVar20._0_8_;
        }
      }
      uVar13 = uVar13 + 1;
      piVar14 = piVar14 + 1;
    } while (uVar13 != 5);
  }
  if ((policy & ~ImGuiPopupPositionPolicy_Tooltip) == ImGuiPopupPositionPolicy_Default) {
    auVar11 = vcmpss_avx(auVar25,auVar22,1);
    auVar25 = vmovshdup_avx(auVar22);
    auVar21 = vblendvps_avx(auVar21,auVar22,auVar11);
    auVar11 = vcmpss_avx(auVar9,auVar25,1);
    auVar11 = vblendvps_avx(auVar31,auVar25,auVar11);
    uVar12 = *last_dir;
    uVar13 = (ulong)(uVar12 == 0xffffffff);
    fVar1 = (r_avoid->Min).x;
    fVar2 = (r_avoid->Min).y;
    fVar3 = (r_avoid->Max).y;
    auVar9 = vmovshdup_avx(auVar26);
    puVar16 = (uint *)(&DAT_001ee660 + (ulong)(uVar12 != 0xffffffff) * -4);
    do {
      puVar15 = (uint *)last_dir;
      if (uVar13 != 0) {
        puVar15 = puVar16;
      }
      uVar7 = *puVar15;
      if ((uVar13 == 0) || (uVar7 != uVar12)) {
        auVar31 = ZEXT416((uint)fVar1);
        if (uVar7 != 0) {
          auVar31 = auVar26;
        }
        auVar28 = ZEXT416((uint)(r_avoid->Max).x);
        auVar19 = auVar28;
        if (uVar7 != 1) {
          auVar19 = auVar22;
        }
        if (fVar23 <= auVar31._0_4_ - auVar19._0_4_ || 1 < uVar7) {
          fVar30 = fVar2;
          if (uVar7 != 2) {
            fVar30 = auVar9._0_4_;
          }
          auVar31 = ZEXT416((uint)fVar3);
          if (uVar7 != 3) {
            auVar31 = auVar25;
          }
          if ((fVar27 <= fVar30 - auVar31._0_4_) || ((uVar7 & 0xfffffffe) != 2)) {
            if (uVar7 == 0) {
              auVar21 = vinsertps_avx(ZEXT416((uint)(fVar1 - fVar23)),auVar11,0x10);
            }
            else if (uVar7 == 1) {
              auVar21 = vinsertps_avx(auVar28,auVar11,0x10);
            }
            else if (uVar7 == 2) {
              auVar21 = vinsertps_avx(auVar21,ZEXT416((uint)(fVar2 - fVar27)),0x10);
            }
            else {
              auVar24 = ZEXT416((uint)fVar3);
              if (uVar7 != 3) {
                auVar24 = auVar11;
              }
              auVar21 = vinsertps_avx(auVar21,auVar24,0x10);
            }
            auVar11 = vcmpps_avx(auVar22,auVar21,2);
            auVar21 = vblendvps_avx(auVar22,auVar21,auVar11);
            *last_dir = uVar7;
            return auVar21._0_8_;
          }
        }
      }
      uVar13 = uVar13 + 1;
      puVar16 = puVar16 + 1;
    } while (uVar13 != 5);
  }
  *last_dir = -1;
  if (policy == ImGuiPopupPositionPolicy_Tooltip) {
    IVar18.x = IVar4.x + 2.0;
    IVar18.y = IVar4.y + 2.0;
  }
  else {
    auVar21._0_4_ = fVar23 + (*ref_pos).x;
    auVar21._4_4_ = IVar18.y + (*ref_pos).y;
    auVar21._8_8_ = 0;
    auVar21 = vminps_avx(auVar21,auVar26);
    auVar11 = vsubps_avx(auVar21,auVar24);
    auVar21 = vcmpps_avx(auVar22,auVar11,2);
    auVar21 = vblendvps_avx(auVar22,auVar11,auVar21);
    IVar18 = auVar21._0_8_;
  }
  return IVar18;
}

Assistant:

ImVec2 ImGui::FindBestWindowPosForPopupEx(const ImVec2& ref_pos, const ImVec2& size, ImGuiDir* last_dir, const ImRect& r_outer, const ImRect& r_avoid, ImGuiPopupPositionPolicy policy)
{
    ImVec2 base_pos_clamped = ImClamp(ref_pos, r_outer.Min, r_outer.Max - size);
    //GetForegroundDrawList()->AddRect(r_avoid.Min, r_avoid.Max, IM_COL32(255,0,0,255));
    //GetForegroundDrawList()->AddRect(r_outer.Min, r_outer.Max, IM_COL32(0,255,0,255));

    // Combo Box policy (we want a connecting edge)
    if (policy == ImGuiPopupPositionPolicy_ComboBox)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Down, ImGuiDir_Right, ImGuiDir_Left, ImGuiDir_Up };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;
            ImVec2 pos;
            if (dir == ImGuiDir_Down)  pos = ImVec2(r_avoid.Min.x, r_avoid.Max.y);          // Below, Toward Right (default)
            if (dir == ImGuiDir_Right) pos = ImVec2(r_avoid.Min.x, r_avoid.Min.y - size.y); // Above, Toward Right
            if (dir == ImGuiDir_Left)  pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Max.y); // Below, Toward Left
            if (dir == ImGuiDir_Up)    pos = ImVec2(r_avoid.Max.x - size.x, r_avoid.Min.y - size.y); // Above, Toward Left
            if (!r_outer.Contains(ImRect(pos, pos + size)))
                continue;
            *last_dir = dir;
            return pos;
        }
    }

    // Tooltip and Default popup policy
    // (Always first try the direction we used on the last frame, if any)
    if (policy == ImGuiPopupPositionPolicy_Tooltip || policy == ImGuiPopupPositionPolicy_Default)
    {
        const ImGuiDir dir_prefered_order[ImGuiDir_COUNT] = { ImGuiDir_Right, ImGuiDir_Down, ImGuiDir_Up, ImGuiDir_Left };
        for (int n = (*last_dir != ImGuiDir_None) ? -1 : 0; n < ImGuiDir_COUNT; n++)
        {
            const ImGuiDir dir = (n == -1) ? *last_dir : dir_prefered_order[n];
            if (n != -1 && dir == *last_dir) // Already tried this direction?
                continue;

            const float avail_w = (dir == ImGuiDir_Left ? r_avoid.Min.x : r_outer.Max.x) - (dir == ImGuiDir_Right ? r_avoid.Max.x : r_outer.Min.x);
            const float avail_h = (dir == ImGuiDir_Up ? r_avoid.Min.y : r_outer.Max.y) - (dir == ImGuiDir_Down ? r_avoid.Max.y : r_outer.Min.y);

            // If there not enough room on one axis, there's no point in positioning on a side on this axis (e.g. when not enough width, use a top/bottom position to maximize available width)
            if (avail_w < size.x && (dir == ImGuiDir_Left || dir == ImGuiDir_Right))
                continue;
            if (avail_h < size.y && (dir == ImGuiDir_Up || dir == ImGuiDir_Down))
                continue;

            ImVec2 pos;
            pos.x = (dir == ImGuiDir_Left) ? r_avoid.Min.x - size.x : (dir == ImGuiDir_Right) ? r_avoid.Max.x : base_pos_clamped.x;
            pos.y = (dir == ImGuiDir_Up) ? r_avoid.Min.y - size.y : (dir == ImGuiDir_Down) ? r_avoid.Max.y : base_pos_clamped.y;

            // Clamp top-left corner of popup
            pos.x = ImMax(pos.x, r_outer.Min.x);
            pos.y = ImMax(pos.y, r_outer.Min.y);

            *last_dir = dir;
            return pos;
        }
    }

    // Fallback when not enough room:
    *last_dir = ImGuiDir_None;

    // For tooltip we prefer avoiding the cursor at all cost even if it means that part of the tooltip won't be visible.
    if (policy == ImGuiPopupPositionPolicy_Tooltip)
        return ref_pos + ImVec2(2, 2);

    // Otherwise try to keep within display
    ImVec2 pos = ref_pos;
    pos.x = ImMax(ImMin(pos.x + size.x, r_outer.Max.x) - size.x, r_outer.Min.x);
    pos.y = ImMax(ImMin(pos.y + size.y, r_outer.Max.y) - size.y, r_outer.Min.y);
    return pos;
}